

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdKelvinPointSprite::is_valid_val(MthdKelvinPointSprite *this)

{
  int iVar1;
  int mode;
  MthdKelvinPointSprite *this_local;
  
  if ((uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3d) >> 0x3e) == 3) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = pgraph_3d_class(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    if (iVar1 < 6) {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffff0f8) == 0;
    }
    else {
      this_local._7_1_ = ((this->super_SingleMthdTest).super_MthdTest.val & 0xfffc00f8) == 0;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		int mode = extr(val, 1, 2);
		if (mode == 3)
			return false;
		if (pgraph_3d_class(&exp) < PGRAPH_3D_CURIE) {
			return !(val & ~0xf07);
		} else {
			return !(val & ~0x3ff07);
		}
	}